

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  int *piVar12;
  double *pdVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  double *pdVar18;
  int iVar19;
  double *pdVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  double *pdVar26;
  long lVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  pdVar8 = this->gPartials[parIndex];
  pdVar9 = this->gTransitionMatrices[probIndex];
  pdVar10 = this->gCategoryWeights[categoryWeightsIndex];
  pdVar11 = this->gStateFrequencies[stateFrequenciesIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  if ((childIndex < this->kTipCount) &&
     (piVar12 = this->gTipStates[childIndex], piVar12 != (int *)0x0)) {
    iVar19 = this->kCategoryCount;
    if (0 < (long)iVar19) {
      uVar5 = this->kPatternCount;
      uVar14 = this->kStateCount;
      iVar6 = this->kMatrixSize;
      iVar7 = this->kPartialsPaddedStateCount;
      lVar23 = 0;
      iVar16 = 0;
      lVar17 = 0;
      do {
        if (0 < (int)uVar5) {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = pdVar10[lVar23];
          pdVar18 = this->integrationTmp;
          iVar24 = this->kTransPaddedStateCount;
          lVar17 = (long)(int)lVar17;
          pdVar20 = pdVar8 + lVar17;
          uVar22 = 0;
          iVar15 = 0;
          do {
            if (0 < (int)uVar14) {
              pdVar26 = pdVar9 + (long)iVar16 + (long)piVar12[uVar22];
              uVar25 = 0;
              do {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pdVar18[(long)iVar15 + uVar25];
                auVar32._8_8_ = 0;
                auVar32._0_8_ = *pdVar26 * pdVar20[uVar25];
                auVar30 = vfmadd213sd_fma(auVar32,auVar29,auVar1);
                pdVar18[(long)iVar15 + uVar25] = auVar30._0_8_;
                uVar25 = uVar25 + 1;
                pdVar26 = pdVar26 + iVar24;
              } while (uVar14 != uVar25);
              iVar15 = iVar15 + (int)uVar25;
            }
            lVar17 = lVar17 + iVar7;
            uVar22 = uVar22 + 1;
            pdVar20 = pdVar20 + iVar7;
          } while (uVar22 != uVar5);
        }
        lVar23 = lVar23 + 1;
        iVar16 = iVar16 + iVar6;
      } while (lVar23 != iVar19);
    }
  }
  else {
    iVar19 = this->kCategoryCount;
    if (0 < (long)iVar19) {
      pdVar20 = this->gPartials[childIndex];
      uVar5 = this->kStateCount;
      uVar14 = uVar5 + 3;
      if (-1 < (int)uVar5) {
        uVar14 = uVar5;
      }
      iVar6 = this->kPatternCount;
      iVar7 = this->kMatrixSize;
      lVar23 = (long)this->kPartialsPaddedStateCount;
      iVar16 = 0;
      lVar17 = 0;
      lVar21 = 0;
      do {
        if (0 < iVar6) {
          auVar30._8_8_ = 0;
          auVar30._0_8_ = pdVar10[lVar17];
          pdVar13 = this->integrationTmp;
          lVar21 = (long)(int)lVar21;
          pdVar18 = pdVar20 + lVar21 + 2;
          pdVar26 = pdVar20 + lVar21;
          iVar24 = 0;
          lVar27 = 0;
          do {
            if (0 < (int)uVar5) {
              lVar27 = (long)(int)lVar27;
              uVar22 = 0;
              iVar15 = iVar16;
              do {
                if ((int)uVar5 < 4) {
                  uVar25 = 0;
                  auVar33 = ZEXT816(0);
                }
                else {
                  auVar33 = ZEXT816(0);
                  uVar25 = 0;
                  do {
                    auVar33 = vfmadd231pd_fma(auVar33,*(undefined1 (*) [16])
                                                       (pdVar9 + (long)iVar15 + uVar25),
                                              *(undefined1 (*) [16])(pdVar18 + (uVar25 - 2)));
                    auVar33 = vfmadd231pd_fma(auVar33,*(undefined1 (*) [16])
                                                       (pdVar9 + (long)iVar15 + uVar25 + 2),
                                              *(undefined1 (*) [16])(pdVar18 + uVar25));
                    uVar25 = uVar25 + 4;
                  } while ((long)uVar25 < (long)(int)(uVar14 & 0xfffffffc));
                }
                dVar28 = auVar33._0_8_;
                if ((int)uVar25 < (int)uVar5) {
                  uVar25 = uVar25 & 0xffffffff;
                  auVar29 = auVar33;
                  do {
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = pdVar9[(long)iVar15 + uVar25];
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = pdVar26[uVar25];
                    auVar29 = vfmadd231sd_fma(auVar29,auVar37,auVar2);
                    dVar28 = auVar29._0_8_;
                    uVar25 = uVar25 + 1;
                  } while (uVar5 != uVar25);
                }
                auVar29 = vshufpd_avx(auVar33,auVar33,1);
                auVar33._8_8_ = 0;
                auVar33._0_8_ = pdVar13[lVar27];
                auVar34._8_8_ = 0;
                auVar34._0_8_ = (auVar29._0_8_ + dVar28) * pdVar8[lVar21 + uVar22];
                auVar33 = vfmadd213sd_fma(auVar34,auVar30,auVar33);
                pdVar13[lVar27] = auVar33._0_8_;
                lVar27 = lVar27 + 1;
                uVar22 = uVar22 + 1;
                iVar15 = iVar15 + uVar5 + 1;
              } while (uVar22 != uVar5);
            }
            lVar21 = lVar21 + lVar23;
            iVar24 = iVar24 + 1;
            pdVar18 = pdVar18 + lVar23;
            pdVar26 = pdVar26 + lVar23;
          } while (iVar24 != iVar6);
        }
        lVar17 = lVar17 + 1;
        iVar16 = iVar16 + iVar7;
      } while (lVar17 != iVar19);
    }
  }
  uVar22 = (ulong)(uint)this->kPatternCount;
  if (0 < this->kPatternCount) {
    lVar17 = 0;
    iVar19 = 0;
    do {
      iVar6 = this->kStateCount;
      if ((long)iVar6 < 1) {
        dVar28 = 0.0;
      }
      else {
        auVar30 = ZEXT816(0);
        lVar23 = 0;
        do {
          auVar35._8_8_ = 0;
          auVar35._0_8_ = pdVar11[lVar23];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = this->integrationTmp[iVar19 + lVar23];
          auVar30 = vfmadd231sd_fma(auVar30,auVar35,auVar3);
          dVar28 = auVar30._0_8_;
          lVar23 = lVar23 + 1;
        } while (iVar6 != lVar23);
        iVar19 = iVar19 + iVar6;
      }
      dVar28 = log(dVar28);
      this->outLogLikelihoodsTmp[lVar17] = dVar28;
      lVar17 = lVar17 + 1;
      uVar22 = (ulong)this->kPatternCount;
    } while (lVar17 < (long)uVar22);
  }
  if ((scalingFactorsIndex != -1) && (0 < (int)uVar22)) {
    pdVar8 = this->gScaleBuffers[scalingFactorsIndex];
    pdVar9 = this->outLogLikelihoodsTmp;
    uVar25 = 0;
    do {
      pdVar9[uVar25] = pdVar8[uVar25] + pdVar9[uVar25];
      uVar25 = uVar25 + 1;
    } while ((uVar22 & 0xffffffff) != uVar25);
  }
  *outSumLogLikelihood = 0.0;
  if (0 < (int)uVar22) {
    pdVar8 = this->gPatternWeights;
    pdVar9 = this->outLogLikelihoodsTmp;
    auVar31 = ZEXT864((ulong)*outSumLogLikelihood);
    uVar25 = 0;
    do {
      auVar36._8_8_ = 0;
      auVar36._0_8_ = pdVar9[uVar25];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pdVar8[uVar25];
      auVar30 = vfmadd231sd_fma(auVar31._0_16_,auVar36,auVar4);
      auVar31 = ZEXT1664(auVar30);
      *outSumLogLikelihood = auVar30._0_8_;
      uVar25 = uVar25 + 1;
    } while ((uVar22 & 0xffffffff) != uVar25);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                     const int childIndex,
                                                     const int probIndex,
                                                     const int categoryWeightsIndex,
                                                     const int stateFrequenciesIndex,
                                                     const int scalingFactorsIndex,
                                                     double* outSumLogLikelihood) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));


    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;
        int stateCountModFour = (kStateCount / 4) * 4;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                const REALTYPE* partialsChildPtr = &partialsChild[v];
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJA = 0.0, sumOverJB = 0.0;
                    int j = 0;
                    const REALTYPE* transMatrixPtr = &transMatrix[w];
                    for (; j < stateCountModFour; j += 4) {
                        sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                        sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                        sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                        sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                    }
                    for (; j < kStateCount; j++) {
                        sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                    }
                    //                        for(int j = 0; j < kStateCount; j++) {
                    //                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                    //                            w++;
                    //                        }
                    integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                    u++;

                    w += kStateCount;

                    // increment for the extra column at the end
                    w += T_PAD;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}